

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O2

void __thiscall
TPZFileEqnStorage<long_double>::~TPZFileEqnStorage(TPZFileEqnStorage<long_double> *this,void **vtt)

{
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  remove((this->fFileName)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&this->fFileName);
  TPZManVector<long,_10>::~TPZManVector(&(this->fBlockPos).super_TPZManVector<long,_10>);
  return;
}

Assistant:

TPZFileEqnStorage<TVar>::~TPZFileEqnStorage()
{
	remove(fFileName.c_str());
}